

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

void __thiscall pbrt::ParameterDictionary::ReportUnused(ParameterDictionary *this)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *ppVar1;
  ParsedParameter **ppPVar2;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar3;
  size_t sVar4;
  ParsedParameter *pPVar5;
  bool bVar6;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *__it;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *__it_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *ppVar8;
  long lVar9;
  ParsedParameter *p;
  InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  seen;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_168;
  undefined1 local_158 [16];
  undefined1 local_148 [264];
  undefined8 local_40;
  long lStack_38;
  
  local_158._8_8_ = pstd::pmr::new_delete_resource();
  local_148._0_8_ =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
        *)0x0;
  local_40 = 0;
  lStack_38 = 0;
  paVar3 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar4 = (this->params).nStored;
  paVar7 = &(this->params).field_2;
  if (paVar3 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar7 = paVar3;
  }
  if (sVar4 != 0) {
    ppPVar2 = paVar7->fixed + sVar4;
    do {
      pPVar5 = paVar7->fixed[0];
      local_158._0_8_ = pPVar5;
      if (pPVar5->mayBeUnused == false) {
        __it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                *)local_148._0_8_;
        if ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             *)local_148._0_8_ ==
            (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             *)0x0) {
          __it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)(local_148 + 8);
        }
        ppVar1 = __it + lStack_38;
        local_168.first =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
        __it_00 = __it;
        if (0 < lStack_38 >> 2) {
          __it_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                     *)((long)&__it->first + (lStack_38 * 0x10 & 0xffffffffffffffc0U));
          lVar9 = (lStack_38 >> 2) + 1;
          do {
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::operator()
                              ((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)
                               &local_168,__it);
            ppVar8 = __it;
            if (bVar6) goto LAB_00396453;
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::operator()
                              ((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)
                               &local_168,__it + 1);
            ppVar8 = __it + 1;
            if (bVar6) goto LAB_00396453;
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::operator()
                              ((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)
                               &local_168,__it + 2);
            ppVar8 = __it + 2;
            if (bVar6) goto LAB_00396453;
            bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::operator()
                              ((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)
                               &local_168,__it + 3);
            ppVar8 = __it + 3;
            if (bVar6) goto LAB_00396453;
            __it = __it + 4;
            lVar9 = lVar9 + -1;
          } while (1 < lVar9);
        }
        lVar9 = (long)ppVar1 - (long)__it_00 >> 4;
        if (lVar9 == 1) {
LAB_0039649b:
          bVar6 = __gnu_cxx::__ops::_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>
                  ::operator()((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)
                               &local_168,__it_00);
          ppVar8 = __it_00;
          if (!bVar6) {
            ppVar8 = ppVar1;
          }
        }
        else if (lVar9 == 2) {
LAB_00396439:
          bVar6 = __gnu_cxx::__ops::_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>
                  ::operator()((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)
                               &local_168,__it_00);
          ppVar8 = __it_00;
          if (!bVar6) {
            __it_00 = __it_00 + 1;
            goto LAB_0039649b;
          }
        }
        else {
          ppVar8 = ppVar1;
          if ((lVar9 == 3) &&
             (bVar6 = __gnu_cxx::__ops::
                      _Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::$_0>::operator()
                                ((_Iter_pred<pbrt::ParameterDictionary::ReportUnused()const::__0> *)
                                 &local_168,__it_00), ppVar8 = __it_00, !bVar6)) {
            __it_00 = __it_00 + 1;
            goto LAB_00396439;
          }
        }
LAB_00396453:
        if (pPVar5->lookedUp == true) {
          if (ppVar8 == ppVar1) {
            local_168.second = &pPVar5->name;
            local_168.first = &pPVar5->type;
            InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
            ::push_back((InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                         *)(local_158 + 8),&local_168);
          }
        }
        else if (ppVar8 == ppVar1) {
          ErrorExit<std::__cxx11::string_const&>
                    (&pPVar5->loc,"\"%s\": unused parameter.",&pPVar5->name);
        }
      }
      paVar7 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                *)((long)paVar7 + 8);
    } while (paVar7 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                        *)ppPVar2);
  }
  InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  ::~InlinedVector((InlinedVector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_16,_pstd::pmr::polymorphic_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                    *)(local_158 + 8));
  return;
}

Assistant:

void ParameterDictionary::ReportUnused() const {
    // type / name
    InlinedVector<std::pair<const std::string *, const std::string *>, 16> seen;

    for (const ParsedParameter *p : params) {
        if (p->mayBeUnused)
            continue;

        bool haveSeen =
            std::find_if(seen.begin(), seen.end(),
                         [&p](std::pair<const std::string *, const std::string *> p2) {
                             return *p2.first == p->type && *p2.second == p->name;
                         }) != seen.end();
        if (p->lookedUp) {
            // A parameter may be used when creating an initial Material, say,
            // but then an override from a Shape may shadow it such that its
            // name is already in the seen array.
            if (!haveSeen)
                seen.push_back(std::make_pair(&p->type, &p->name));
        } else if (haveSeen) {
            // It's shadowed by another parameter; that's fine.
        } else
            ErrorExit(&p->loc, "\"%s\": unused parameter.", p->name);
    }
}